

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::DecodeBase58Request::DecodeBase58Request(DecodeBase58Request *this)

{
  allocator local_11;
  DecodeBase58Request *local_10;
  DecodeBase58Request *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::DecodeBase58Request>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::DecodeBase58Request>);
  (this->super_JsonClassBase<cfd::js::api::json::DecodeBase58Request>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodeBase58Request_01b3da58;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->data_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->has_checksum_ = true;
  CollectFieldName();
  return;
}

Assistant:

DecodeBase58Request() {
    CollectFieldName();
  }